

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_lzhuf.cxx
# Opt level: O1

void __thiscall xray_re::_lzhuf::InsertNode(_lzhuf *this,int r)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  
  iVar4 = this->text_buf[r] + 0x1001;
  this->lson[r] = 0x1000;
  this->rson[r] = 0x1000;
  this->match_length = 0;
  iVar2 = 1;
  uVar6 = 0;
  uVar5 = this->match_position;
  do {
    if (iVar2 < 0) {
      iVar2 = this->lson[iVar4];
      if (iVar2 == 0x1000) {
        this->lson[iVar4] = r;
        goto LAB_00170011;
      }
    }
    else {
      iVar2 = this->rson[iVar4];
      if (iVar2 == 0x1000) {
        this->rson[iVar4] = r;
LAB_00170011:
        this->dad[r] = iVar4;
        return;
      }
    }
    iVar4 = iVar2;
    lVar7 = 1;
    do {
      iVar2 = (uint)this->text_buf[lVar7 + r] - (uint)this->text_buf[lVar7 + iVar4];
      if (iVar2 != 0) goto LAB_0016ffa0;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x3c);
    iVar2 = 0;
    lVar7 = 0x3c;
LAB_0016ffa0:
    uVar3 = (uint)lVar7;
    if (2 < uVar3) {
      if ((int)uVar6 < (int)uVar3) {
        uVar5 = (r - iVar4 & 0xfffU) - 1;
        this->match_position = uVar5;
        this->match_length = uVar3;
        uVar6 = uVar3;
        if (0x3b < uVar3) {
          this->dad[r] = this->dad[iVar4];
          this->lson[r] = this->lson[iVar4];
          this->rson[r] = this->rson[iVar4];
          this->dad[this->lson[iVar4]] = r;
          this->dad[this->rson[iVar4]] = r;
          piVar1 = this->lson;
          if (this->rson[this->dad[iVar4]] == iVar4) {
            piVar1 = this->rson;
          }
          piVar1[this->dad[iVar4]] = r;
          this->dad[iVar4] = 0x1000;
          return;
        }
      }
      if ((uVar3 == uVar6) && (uVar3 = (r - iVar4 & 0xfffU) - 1, uVar3 < uVar5)) {
        this->match_position = uVar3;
        uVar5 = uVar3;
      }
    }
  } while( true );
}

Assistant:

void _lzhuf::InsertNode(int r)  /* insert to tree */
{
	int  i, p, cmp;
	unsigned char  *key;
	unsigned c;

	cmp = 1;
	key = &text_buf[r];
	p = N + 1 + key[0];
	rson[r] = lson[r] = NIL;
	match_length = 0;
	for ( ; ; ) {
		if (cmp >= 0) {
			if (rson[p] != NIL)
				p = rson[p];
			else {
				rson[p] = r;
				dad[r] = p;
				return;
			}
		} else {
			if (lson[p] != NIL)
				p = lson[p];
			else {
				lson[p] = r;
				dad[r] = p;
				return;
			}
		}
		for (i = 1; i < F; i++)
			if ((cmp = key[i] - text_buf[p + i]) != 0)
				break;
		if (i > THRESHOLD) {
			if (i > match_length) {
				match_position = ((r - p) & (N - 1)) - 1;
				if ((match_length = i) >= F)
					break;
			}
			if (i == match_length) {
				if ((c = ((r - p) & (N - 1)) - 1) < (unsigned)match_position) {
					match_position = c;
				}
			}
		}
	}
	dad[r] = dad[p];
	lson[r] = lson[p];
	rson[r] = rson[p];
	dad[lson[p]] = r;
	dad[rson[p]] = r;
	if (rson[dad[p]] == p)
		rson[dad[p]] = r;
	else
		lson[dad[p]] = r;
	dad[p] = NIL;  /* remove p */
}